

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChException.h
# Opt level: O1

void __thiscall chrono::ChException::ChException(ChException *this,string *swhat)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__ChException_001358b0;
  (this->m_swhat)._M_dataplus._M_p = (pointer)&(this->m_swhat).field_2;
  pcVar1 = (swhat->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_swhat,pcVar1,pcVar1 + swhat->_M_string_length);
  return;
}

Assistant:

ChException(std::string swhat) : m_swhat(swhat){}